

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

GLchar * gl4cts::GLSL420Pack::Utils::getQualifierString(QUALIFIERS qualifier)

{
  TestError *this;
  
  if (qualifier < QUAL_MAX) {
    return &DAT_01a82900 + *(int *)(&DAT_01a82900 + (ulong)qualifier * 4);
  }
  this = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0x108);
  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

const GLchar* Utils::getQualifierString(Utils::QUALIFIERS qualifier)
{
	const GLchar* result = 0;
	switch (qualifier)
	{
	case QUAL_NONE:
		result = "";
		break;
	case QUAL_CONST:
		result = "const";
		break;
	case QUAL_IN:
		result = "in";
		break;
	case QUAL_OUT:
		result = "out";
		break;
	case QUAL_INOUT:
		result = "inout";
		break;
	case QUAL_UNIFORM:
		result = "uniform";
		break;
	case QUAL_PATCH:
		result = "patch";
		break;
	case QUAL_CENTROID:
		result = "centroid";
		break;
	case QUAL_SAMPLE:
		result = "sample";
		break;
	case QUAL_FLAT:
		result = "flat";
		break;
	case QUAL_NOPERSPECTIVE:
		result = "noperspective";
		break;
	case QUAL_SMOOTH:
		result = "smooth";
		break;
	case QUAL_LOCATION:
		result = "layout (location = LOC_VALUE)";
		break;
	case QUAL_LOWP:
		result = "lowp";
		break;
	case QUAL_MEDIUMP:
		result = "mediump";
		break;
	case QUAL_HIGHP:
		result = "highp";
		break;
	case QUAL_PRECISE:
		result = "precise";
		break;
	case QUAL_INVARIANT:
		result = "invariant";
		break;
	default:
		TCU_FAIL("Invalid enum");
	};

	return result;
}